

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<mp::PLTerm>::Matcher(Matcher<mp::PLTerm> *this,PLTerm value)

{
  EqMatcher<mp::PLTerm> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::PLTerm> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::PLTerm>::MatcherBase((MatcherBase<mp::PLTerm> *)0x155d2c);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_0029f9c8;
  this_00 = Eq<mp::PLTerm>((PLTerm)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::PLTerm> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
            impl_,(Matcher<mp::PLTerm> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::PLTerm> *)0x155d8a);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }